

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

int refineBySim1_init(saucy *s,coloring *c)

{
  int *__ptr;
  int *__ptr_00;
  int iVar1;
  int iVar2;
  long lVar3;
  Vec_Int_t *randVec;
  saucy_graph *__ptr_01;
  int *piVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  if ((s->pNtk->vPos->nSize != 1) && (0 < NUM_SIM1_ITERATION)) {
    iVar2 = 0;
    while( true ) {
      lVar3 = (long)s->pNtk->vPos->nSize;
      if (lVar3 < 1) break;
      lVar7 = 0;
      while (c->clen[lVar7] == 0) {
        lVar7 = lVar7 + 1;
        if (lVar3 == lVar7) {
          return 1;
        }
      }
      randVec = assignRandomBitsToCells(s->pNtk,c);
      __ptr_01 = buildSim1Graph(s->pNtk,c,randVec,s->iDep,s->oDep);
      if (__ptr_01 == (saucy_graph *)0x0) {
        __assert_fail("g != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSaucy.c"
                      ,0x4d0,"int refineBySim1_init(struct saucy *, struct coloring *)");
      }
      __ptr = __ptr_01->adj;
      s->adj = __ptr;
      __ptr_00 = __ptr_01->edg;
      s->edg = __ptr_00;
      iVar6 = s->nsplits;
      if (0 < s->n) {
        piVar4 = c->clen;
        iVar1 = 0;
        do {
          if (piVar4[iVar1] == 0) {
            piVar4 = s->sinduce;
            iVar5 = s->nsinduce;
            s->nsinduce = iVar5 + 1;
          }
          else {
            piVar4 = s->ninduce;
            iVar5 = s->nninduce;
            s->nninduce = iVar5 + 1;
          }
          piVar4[iVar5] = iVar1;
          s->indmark[iVar1] = '\x01';
          piVar4 = c->clen;
          iVar1 = iVar1 + piVar4[iVar1] + 1;
        } while (iVar1 < s->n);
      }
      refine(s,c);
      if (iVar6 < s->nsplits) {
        if (0 < s->n) {
          piVar4 = c->clen;
          iVar2 = 0;
          do {
            if (piVar4[iVar2] == 0) {
              piVar4 = s->sinduce;
              iVar6 = s->nsinduce;
              s->nsinduce = iVar6 + 1;
            }
            else {
              piVar4 = s->ninduce;
              iVar6 = s->nninduce;
              s->nninduce = iVar6 + 1;
            }
            piVar4[iVar6] = iVar2;
            s->indmark[iVar2] = '\x01';
            piVar4 = c->clen;
            iVar2 = iVar2 + piVar4[iVar2] + 1;
          } while (iVar2 < s->n);
        }
        s->adj = s->depAdj;
        s->edg = s->depEdg;
        refine(s,c);
        iVar2 = 0;
      }
      if (randVec->pArray != (int *)0x0) {
        free(randVec->pArray);
      }
      free(randVec);
      if (__ptr != (int *)0x0) {
        free(__ptr);
      }
      if (__ptr_00 != (int *)0x0) {
        free(__ptr_00);
      }
      free(__ptr_01);
      iVar2 = iVar2 + 1;
      if (NUM_SIM1_ITERATION <= iVar2) {
        return 1;
      }
    }
  }
  return 1;
}

Assistant:

static int
refineBySim1_init(struct saucy *s, struct coloring *c) 
{
    struct saucy_graph *g;
    Vec_Int_t * randVec;
    int i, j;
    int allOutputsAreDistinguished;
    int nsplits;

    if (Abc_NtkPoNum(s->pNtk) == 1) return 1;
    
    for (i = 0; i < NUM_SIM1_ITERATION; i++) {

        /* if all outputs are distinguished, quit */
        allOutputsAreDistinguished = 1;
        for (j = 0; j < Abc_NtkPoNum(s->pNtk); j++) {
            if (c->clen[j]) {
                allOutputsAreDistinguished = 0;
                break;
            }
        }
        if (allOutputsAreDistinguished) break;

        randVec = assignRandomBitsToCells(s->pNtk, c);      
        g = buildSim1Graph(s->pNtk, c, randVec, s->iDep, s->oDep);
        assert(g != NULL);

        s->adj = g->adj;
        s->edg = g->edg;

        nsplits = s->nsplits;

        for (j = 0; j < s->n; j += c->clen[j]+1)            
                add_induce(s, c, j);
        refine(s, c);

        if (s->nsplits > nsplits) {         
            i = 0; /* reset i */
            /* do more refinement by dependency graph */
            for (j = 0; j < s->n; j += c->clen[j]+1)                
                    add_induce(s, c, j);
            refineByDepGraph(s, c);
        }
        
        Vec_IntFree(randVec);
        ABC_FREE( g->adj );
        ABC_FREE( g->edg );
        ABC_FREE( g );
    }   

    return 1;
}